

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

RealType __thiscall OpenMD::Thermo::getGyrationalVolume(Thermo *this)

{
  Snapshot *this_00;
  double dVar1;
  RealType RVar2;
  double dVar3;
  Vector3d dummyAngMom;
  Mat3x3d intTensor;
  Vector3d local_88;
  Mat3x3d local_68;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasGyrationalVolume == false) {
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_88.super_Vector<double,_3U>.data_[2] = 0.0;
    local_88.super_Vector<double,_3U>.data_[0] = 0.0;
    local_88.super_Vector<double,_3U>.data_[1] = 0.0;
    getInertiaTensor(this,&local_68,&local_88);
    dVar3 = (local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] *
             local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] -
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] *
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) *
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] +
            (local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] *
             local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] -
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] *
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]) *
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
            (local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
             local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] -
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] *
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0]) *
            local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
    dVar1 = pow(1.5 / (double)this->info_->nGlobalIntegrableObjects_,1.5);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    Snapshot::setGyrationalVolume(this_00,dVar1 * 4.1887902047863905 * dVar3);
  }
  RVar2 = Snapshot::getGyrationalVolume(this_00);
  return RVar2;
}

Assistant:

RealType Thermo::getGyrationalVolume() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasGyrationalVolume) {
      Mat3x3d intTensor;
      RealType det;
      Vector3d dummyAngMom;
      RealType sysconstants;
      RealType geomCnst;
      RealType volume;

      geomCnst = 3.0 / 2.0;
      /* Get the inertial tensor and angular momentum for free*/
      getInertiaTensor(intTensor, dummyAngMom);

      det = intTensor.determinant();
      sysconstants =
          geomCnst / (RealType)(info_->getNGlobalIntegrableObjects());
      volume =
          4.0 / 3.0 * Constants::PI * pow(sysconstants, geomCnst) * sqrt(det);

      snap->setGyrationalVolume(volume);
    }
    return snap->getGyrationalVolume();
  }